

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O2

char * get_suffix(char *path,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar2 = strlen(path);
  sVar3 = strlen(suffix);
  if (sVar2 < sVar3 || sVar2 - sVar3 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar1 = strcmp(path + (sVar2 - sVar3),suffix);
    pcVar4 = (char *)0x0;
    if (iVar1 == 0) {
      pcVar4 = path + (sVar2 - sVar3);
    }
  }
  return pcVar4;
}

Assistant:

static const tchar *
get_suffix(const tchar *path, const tchar *suffix)
{
	size_t path_len = tstrlen(path);
	size_t suffix_len = tstrlen(suffix);
	const tchar *p;

	if (path_len <= suffix_len)
		return NULL;
	p = &path[path_len - suffix_len];
	if (tstrxcmp(p, suffix) == 0)
		return p;
	return NULL;
}